

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderDNA.cpp
# Opt level: O3

void __thiscall Assimp::Blender::DNA::AddPrimitiveStructures(DNA *this)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  *this_00;
  vector<Assimp::Blender::Structure> *this_01;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Rb_tree_header *p_Var2;
  pointer pSVar3;
  pointer pSVar4;
  mapped_type *pmVar5;
  Structure local_a8;
  
  pSVar3 = (this->structures).
           super_vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>.
           super__Vector_base<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pSVar4 = (this->structures).
           super_vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>.
           super__Vector_base<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>
           ._M_impl.super__Vector_impl_data._M_start;
  paVar1 = &local_a8.name.field_2;
  local_a8.name._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"int","");
  this_00 = &this->indices;
  pmVar5 = ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
           ::operator[](this_00,&local_a8.name);
  this_01 = &this->structures;
  *pmVar5 = ((long)pSVar3 - (long)pSVar4 >> 3) * -0x1111111111111111;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8.name._M_dataplus._M_p);
  }
  p_Var2 = &local_a8.indices._M_t._M_impl.super__Rb_tree_header;
  local_a8.name._M_string_length = 0;
  local_a8.name.field_2._M_local_buf[0] = '\0';
  local_a8.fields.super_vector<Assimp::Blender::Field,_std::allocator<Assimp::Blender::Field>_>.
  super__Vector_base<Assimp::Blender::Field,_std::allocator<Assimp::Blender::Field>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.fields.super_vector<Assimp::Blender::Field,_std::allocator<Assimp::Blender::Field>_>.
  super__Vector_base<Assimp::Blender::Field,_std::allocator<Assimp::Blender::Field>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.fields.super_vector<Assimp::Blender::Field,_std::allocator<Assimp::Blender::Field>_>.
  super__Vector_base<Assimp::Blender::Field,_std::allocator<Assimp::Blender::Field>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8.indices._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_a8.indices._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_a8.indices._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_a8.cache_idx = 0xffffffffffffffff;
  local_a8.name._M_dataplus._M_p = (pointer)paVar1;
  local_a8.indices._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  local_a8.indices._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  ::std::vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>::
  emplace_back<Assimp::Blender::Structure>
            (&this_01->
              super_vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>,
             &local_a8);
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::~_Rb_tree(&local_a8.indices._M_t);
  ::std::vector<Assimp::Blender::Field,_std::allocator<Assimp::Blender::Field>_>::~vector
            (&local_a8.fields.
              super_vector<Assimp::Blender::Field,_std::allocator<Assimp::Blender::Field>_>);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8.name._M_dataplus._M_p);
  }
  pSVar3 = (this->structures).
           super_vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>.
           super__Vector_base<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  ::std::__cxx11::string::_M_replace
            ((ulong)(pSVar3 + -1),0,(char *)pSVar3[-1].name._M_string_length,0x73aaff);
  (this->structures).
  super_vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>.
  super__Vector_base<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>.
  _M_impl.super__Vector_impl_data._M_finish[-1].size = 4;
  pSVar3 = (this->structures).
           super_vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>.
           super__Vector_base<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pSVar4 = (this->structures).
           super_vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>.
           super__Vector_base<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_a8.name._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"short","");
  pmVar5 = ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
           ::operator[](this_00,&local_a8.name);
  *pmVar5 = ((long)pSVar3 - (long)pSVar4 >> 3) * -0x1111111111111111;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8.name._M_dataplus._M_p);
  }
  local_a8.name._M_string_length = 0;
  local_a8.name.field_2._M_local_buf[0] = '\0';
  local_a8.fields.super_vector<Assimp::Blender::Field,_std::allocator<Assimp::Blender::Field>_>.
  super__Vector_base<Assimp::Blender::Field,_std::allocator<Assimp::Blender::Field>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.fields.super_vector<Assimp::Blender::Field,_std::allocator<Assimp::Blender::Field>_>.
  super__Vector_base<Assimp::Blender::Field,_std::allocator<Assimp::Blender::Field>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.fields.super_vector<Assimp::Blender::Field,_std::allocator<Assimp::Blender::Field>_>.
  super__Vector_base<Assimp::Blender::Field,_std::allocator<Assimp::Blender::Field>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8.indices._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_a8.indices._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_a8.indices._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_a8.cache_idx = 0xffffffffffffffff;
  local_a8.name._M_dataplus._M_p = (pointer)paVar1;
  local_a8.indices._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  local_a8.indices._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  ::std::vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>::
  emplace_back<Assimp::Blender::Structure>
            (&this_01->
              super_vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>,
             &local_a8);
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::~_Rb_tree(&local_a8.indices._M_t);
  ::std::vector<Assimp::Blender::Field,_std::allocator<Assimp::Blender::Field>_>::~vector
            (&local_a8.fields.
              super_vector<Assimp::Blender::Field,_std::allocator<Assimp::Blender::Field>_>);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8.name._M_dataplus._M_p);
  }
  pSVar3 = (this->structures).
           super_vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>.
           super__Vector_base<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  ::std::__cxx11::string::_M_replace
            ((ulong)(pSVar3 + -1),0,(char *)pSVar3[-1].name._M_string_length,0x78bf0c);
  (this->structures).
  super_vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>.
  super__Vector_base<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>.
  _M_impl.super__Vector_impl_data._M_finish[-1].size = 2;
  pSVar3 = (this->structures).
           super_vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>.
           super__Vector_base<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pSVar4 = (this->structures).
           super_vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>.
           super__Vector_base<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_a8.name._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"char","");
  pmVar5 = ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
           ::operator[](this_00,&local_a8.name);
  *pmVar5 = ((long)pSVar3 - (long)pSVar4 >> 3) * -0x1111111111111111;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8.name._M_dataplus._M_p);
  }
  local_a8.name._M_string_length = 0;
  local_a8.name.field_2._M_local_buf[0] = '\0';
  local_a8.fields.super_vector<Assimp::Blender::Field,_std::allocator<Assimp::Blender::Field>_>.
  super__Vector_base<Assimp::Blender::Field,_std::allocator<Assimp::Blender::Field>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.fields.super_vector<Assimp::Blender::Field,_std::allocator<Assimp::Blender::Field>_>.
  super__Vector_base<Assimp::Blender::Field,_std::allocator<Assimp::Blender::Field>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.fields.super_vector<Assimp::Blender::Field,_std::allocator<Assimp::Blender::Field>_>.
  super__Vector_base<Assimp::Blender::Field,_std::allocator<Assimp::Blender::Field>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8.indices._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_a8.indices._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_a8.indices._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_a8.cache_idx = 0xffffffffffffffff;
  local_a8.name._M_dataplus._M_p = (pointer)paVar1;
  local_a8.indices._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  local_a8.indices._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  ::std::vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>::
  emplace_back<Assimp::Blender::Structure>
            (&this_01->
              super_vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>,
             &local_a8);
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::~_Rb_tree(&local_a8.indices._M_t);
  ::std::vector<Assimp::Blender::Field,_std::allocator<Assimp::Blender::Field>_>::~vector
            (&local_a8.fields.
              super_vector<Assimp::Blender::Field,_std::allocator<Assimp::Blender::Field>_>);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8.name._M_dataplus._M_p);
  }
  pSVar3 = (this->structures).
           super_vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>.
           super__Vector_base<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  ::std::__cxx11::string::_M_replace
            ((ulong)(pSVar3 + -1),0,(char *)pSVar3[-1].name._M_string_length,0x7679b8);
  (this->structures).
  super_vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>.
  super__Vector_base<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>.
  _M_impl.super__Vector_impl_data._M_finish[-1].size = 1;
  pSVar3 = (this->structures).
           super_vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>.
           super__Vector_base<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pSVar4 = (this->structures).
           super_vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>.
           super__Vector_base<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_a8.name._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"float","");
  pmVar5 = ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
           ::operator[](this_00,&local_a8.name);
  *pmVar5 = ((long)pSVar3 - (long)pSVar4 >> 3) * -0x1111111111111111;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8.name._M_dataplus._M_p);
  }
  local_a8.name._M_string_length = 0;
  local_a8.name.field_2._M_local_buf[0] = '\0';
  local_a8.fields.super_vector<Assimp::Blender::Field,_std::allocator<Assimp::Blender::Field>_>.
  super__Vector_base<Assimp::Blender::Field,_std::allocator<Assimp::Blender::Field>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.fields.super_vector<Assimp::Blender::Field,_std::allocator<Assimp::Blender::Field>_>.
  super__Vector_base<Assimp::Blender::Field,_std::allocator<Assimp::Blender::Field>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.fields.super_vector<Assimp::Blender::Field,_std::allocator<Assimp::Blender::Field>_>.
  super__Vector_base<Assimp::Blender::Field,_std::allocator<Assimp::Blender::Field>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8.indices._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_a8.indices._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_a8.indices._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_a8.cache_idx = 0xffffffffffffffff;
  local_a8.name._M_dataplus._M_p = (pointer)paVar1;
  local_a8.indices._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  local_a8.indices._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  ::std::vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>::
  emplace_back<Assimp::Blender::Structure>
            (&this_01->
              super_vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>,
             &local_a8);
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::~_Rb_tree(&local_a8.indices._M_t);
  ::std::vector<Assimp::Blender::Field,_std::allocator<Assimp::Blender::Field>_>::~vector
            (&local_a8.fields.
              super_vector<Assimp::Blender::Field,_std::allocator<Assimp::Blender::Field>_>);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8.name._M_dataplus._M_p);
  }
  pSVar3 = (this->structures).
           super_vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>.
           super__Vector_base<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  ::std::__cxx11::string::_M_replace
            ((ulong)(pSVar3 + -1),0,(char *)pSVar3[-1].name._M_string_length,0x75b15a);
  (this->structures).
  super_vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>.
  super__Vector_base<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>.
  _M_impl.super__Vector_impl_data._M_finish[-1].size = 4;
  pSVar3 = (this->structures).
           super_vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>.
           super__Vector_base<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pSVar4 = (this->structures).
           super_vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>.
           super__Vector_base<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_a8.name._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"double","");
  pmVar5 = ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
           ::operator[](this_00,&local_a8.name);
  *pmVar5 = ((long)pSVar3 - (long)pSVar4 >> 3) * -0x1111111111111111;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8.name._M_dataplus._M_p);
  }
  local_a8.name._M_string_length = 0;
  local_a8.name.field_2._M_local_buf[0] = '\0';
  local_a8.fields.super_vector<Assimp::Blender::Field,_std::allocator<Assimp::Blender::Field>_>.
  super__Vector_base<Assimp::Blender::Field,_std::allocator<Assimp::Blender::Field>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.fields.super_vector<Assimp::Blender::Field,_std::allocator<Assimp::Blender::Field>_>.
  super__Vector_base<Assimp::Blender::Field,_std::allocator<Assimp::Blender::Field>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.fields.super_vector<Assimp::Blender::Field,_std::allocator<Assimp::Blender::Field>_>.
  super__Vector_base<Assimp::Blender::Field,_std::allocator<Assimp::Blender::Field>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8.indices._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_a8.indices._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_a8.indices._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_a8.cache_idx = 0xffffffffffffffff;
  local_a8.name._M_dataplus._M_p = (pointer)paVar1;
  local_a8.indices._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  local_a8.indices._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  ::std::vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>::
  emplace_back<Assimp::Blender::Structure>
            (&this_01->
              super_vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>,
             &local_a8);
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::~_Rb_tree(&local_a8.indices._M_t);
  ::std::vector<Assimp::Blender::Field,_std::allocator<Assimp::Blender::Field>_>::~vector
            (&local_a8.fields.
              super_vector<Assimp::Blender::Field,_std::allocator<Assimp::Blender::Field>_>);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8.name._M_dataplus._M_p);
  }
  pSVar3 = (this->structures).
           super_vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>.
           super__Vector_base<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  ::std::__cxx11::string::_M_replace
            ((ulong)(pSVar3 + -1),0,(char *)pSVar3[-1].name._M_string_length,0x73ab62);
  (this->structures).
  super_vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>.
  super__Vector_base<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>.
  _M_impl.super__Vector_impl_data._M_finish[-1].size = 8;
  return;
}

Assistant:

void DNA :: AddPrimitiveStructures()
{
    // NOTE: these are just dummies. Their presence enforces
    // Structure::Convert<target_type> to be called on these
    // empty structures. These converters are special
    // overloads which scan the name of the structure and
    // perform the required data type conversion if one
    // of these special names is found in the structure
    // in question.

    indices["int"] = structures.size();
    structures.push_back( Structure() );
    structures.back().name = "int";
    structures.back().size = 4;

    indices["short"] = structures.size();
    structures.push_back( Structure() );
    structures.back().name = "short";
    structures.back().size = 2;


    indices["char"] = structures.size();
    structures.push_back( Structure() );
    structures.back().name = "char";
    structures.back().size = 1;


    indices["float"] = structures.size();
    structures.push_back( Structure() );
    structures.back().name = "float";
    structures.back().size = 4;


    indices["double"] = structures.size();
    structures.push_back( Structure() );
    structures.back().name = "double";
    structures.back().size = 8;

    // no long, seemingly.
}